

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O2

int64_t __thiscall
disruptor::BusySpinStrategy::WaitFor
          (BusySpinStrategy *this,int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted)

{
  long lVar1;
  code *pcVar2;
  code *pcVar3;
  bool bVar4;
  function<long_()> min_sequence;
  
  bVar4 = (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_finish !=
          (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_start;
  if (bVar4) {
    cursor = (Sequence *)dependents;
  }
  pcVar2 = std::
           _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
           ::_M_invoke;
  if (!bVar4) {
    pcVar2 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
             ::_M_invoke;
  }
  pcVar3 = std::
           _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
           ::_M_manager;
  if (!bVar4) {
    pcVar3 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
             ::_M_manager;
  }
  min_sequence.super__Function_base._M_functor._8_8_ = 0;
  min_sequence.super__Function_base._M_functor._M_unused._M_object = cursor;
  min_sequence.super__Function_base._M_manager = pcVar3;
  min_sequence._M_invoker = pcVar2;
  do {
    lVar1 = std::function<long_()>::operator()(&min_sequence);
    if (*sequence <= lVar1) break;
    lVar1 = -2;
  } while (((alerted->_M_base)._M_i & 1U) == 0);
  std::_Function_base::~_Function_base(&min_sequence.super__Function_base);
  return lVar1;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted) {
    int64_t available_sequence = kInitialCursorValue;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      SpinPause();
    }

    return available_sequence;
  }